

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

void on_link_flow_on(void *context)

{
  MESSAGE_SENDER_HANDLE message_sender;
  void *context_local;
  
  send_all_pending_messages((MESSAGE_SENDER_HANDLE)context);
  return;
}

Assistant:

static void on_link_flow_on(void* context)
{
    MESSAGE_SENDER_HANDLE message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    send_all_pending_messages(message_sender);
}